

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void number_suite::value_uint16(void)

{
  size_type sVar1;
  UI_STRING *uis;
  char *ui;
  undefined4 local_1e8;
  value local_1e4;
  undefined1 local_1df;
  undefined1 local_1de [2];
  undefined4 local_1dc;
  type_conflict6 local_1d8 [2];
  undefined4 local_1d0;
  type_conflict8 local_1cc [22];
  error *ex_2;
  undefined4 local_194;
  value local_190 [2];
  undefined4 local_188;
  value local_184;
  undefined1 local_17f;
  undefined1 local_17e [2];
  undefined4 local_17c;
  type_conflict6 local_178 [2];
  undefined4 local_170;
  type_conflict8 local_16c [22];
  error *ex_1;
  value local_138 [2];
  undefined4 local_130;
  value local_12c [2];
  undefined4 local_124;
  value local_120;
  undefined1 local_11b;
  undefined1 local_11a [2];
  undefined8 local_118;
  type_conflict7 local_110;
  undefined4 local_104;
  type_conflict6 local_100 [2];
  undefined4 local_f8;
  type_conflict8 local_f4 [22];
  error *ex;
  value local_c0 [2];
  undefined4 local_b8;
  value local_b4 [6];
  undefined4 local_9c;
  value local_98 [2];
  undefined1 local_90 [8];
  reader reader;
  value_type input [9];
  
  reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0xffb28000b27fffb2;
  trial::protocol::bintoken::reader::reader<unsigned_char[9]>
            ((reader *)local_90,
             (uchar (*) [9])
             ((long)&reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  local_98[0] = trial::protocol::bintoken::reader::code((reader *)local_90);
  local_9c = 0xb2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::int16",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1a1,"void number_suite::value_uint16()",local_98,&local_9c);
  local_b4[0] = trial::protocol::bintoken::reader::symbol((reader *)local_90);
  local_b8 = 4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1a2,"void number_suite::value_uint16()",local_b4,&local_b8);
  local_c0[0] = trial::protocol::bintoken::reader::category((reader *)local_90);
  ex._4_4_ = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1a3,"void number_suite::value_uint16()",local_c0,(long)&ex + 4);
  sVar1 = trial::protocol::bintoken::reader::length((reader *)local_90);
  boost::detail::test_impl
            ("reader.length() == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1a4,"void number_suite::value_uint16()",sVar1 == 1);
  trial::protocol::bintoken::reader::value<unsigned_char>((reader *)local_90);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<std::uint8_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1a6,"void number_suite::value_uint16()");
  local_f4[0] = trial::protocol::bintoken::reader::value<unsigned_short>((reader *)local_90);
  local_f8 = 0x7fff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_short,int>
            ("reader.value<std::uint16_t>()","0x7FFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1a7,"void number_suite::value_uint16()",local_f4,&local_f8);
  local_100[0] = trial::protocol::bintoken::reader::value<unsigned_int>((reader *)local_90);
  local_104 = 0x7fff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,int>
            ("reader.value<std::uint32_t>()","0x00007FFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1a8,"void number_suite::value_uint16()",local_100,&local_104);
  local_110 = trial::protocol::bintoken::reader::value<unsigned_long>((reader *)local_90);
  local_118 = 0x7fff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,unsigned_long>
            ("reader.value<std::uint64_t>()","UINT64_C(0x0000000000007FFF)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1a9,"void number_suite::value_uint16()",&local_110,&local_118);
  local_11a[0] = trial::protocol::bintoken::reader::next((reader *)local_90);
  local_11b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1aa,"void number_suite::value_uint16()",local_11a,&local_11b);
  local_120 = trial::protocol::bintoken::reader::code((reader *)local_90);
  local_124 = 0xb2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::int16",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1ab,"void number_suite::value_uint16()",&local_120,&local_124);
  local_12c[0] = trial::protocol::bintoken::reader::symbol((reader *)local_90);
  local_130 = 4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1ac,"void number_suite::value_uint16()",local_12c,&local_130);
  local_138[0] = trial::protocol::bintoken::reader::category((reader *)local_90);
  ex_1._4_4_ = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1ad,"void number_suite::value_uint16()",local_138,(long)&ex_1 + 4);
  trial::protocol::bintoken::reader::value<unsigned_char>((reader *)local_90);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<std::uint8_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1af,"void number_suite::value_uint16()");
  local_16c[0] = trial::protocol::bintoken::reader::value<unsigned_short>((reader *)local_90);
  local_170 = 0x8000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_short,int>
            ("reader.value<std::uint16_t>()","0x8000",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b0,"void number_suite::value_uint16()",local_16c,&local_170);
  local_178[0] = trial::protocol::bintoken::reader::value<unsigned_int>((reader *)local_90);
  local_17c = 0x8000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,int>
            ("reader.value<std::uint32_t>()","0x00008000",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b1,"void number_suite::value_uint16()",local_178,&local_17c);
  local_17e[0] = trial::protocol::bintoken::reader::next((reader *)local_90);
  local_17f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b2,"void number_suite::value_uint16()",local_17e,&local_17f);
  local_184 = trial::protocol::bintoken::reader::code((reader *)local_90);
  local_188 = 0xb2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::int16",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b3,"void number_suite::value_uint16()",&local_184,&local_188);
  local_190[0] = trial::protocol::bintoken::reader::symbol((reader *)local_90);
  local_194 = 4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b4,"void number_suite::value_uint16()",local_190,&local_194);
  ex_2._4_4_ = trial::protocol::bintoken::reader::category((reader *)local_90);
  ex_2._0_4_ = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b5,"void number_suite::value_uint16()",(long)&ex_2 + 4,&ex_2);
  trial::protocol::bintoken::reader::value<unsigned_char>((reader *)local_90);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<std::uint8_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b7,"void number_suite::value_uint16()");
  local_1cc[0] = trial::protocol::bintoken::reader::value<unsigned_short>((reader *)local_90);
  local_1d0 = 0xffff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_short,int>
            ("reader.value<std::uint16_t>()","0xFFFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b8,"void number_suite::value_uint16()",local_1cc,&local_1d0);
  local_1d8[0] = trial::protocol::bintoken::reader::value<unsigned_int>((reader *)local_90);
  local_1dc = 0xffff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,int>
            ("reader.value<std::uint32_t>()","0x0000FFFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1b9,"void number_suite::value_uint16()",local_1d8,&local_1dc);
  local_1de[0] = trial::protocol::bintoken::reader::next((reader *)local_90);
  local_1df = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1ba,"void number_suite::value_uint16()",local_1de,&local_1df);
  local_1e4 = trial::protocol::bintoken::reader::code((reader *)local_90);
  local_1e8 = 0;
  ui = "token::code::end";
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1bb,"void number_suite::value_uint16()",&local_1e4,&local_1e8);
  trial::protocol::bintoken::reader::~reader((reader *)local_90,(UI *)ui,uis);
  return;
}

Assistant:

void value_uint16()
{
    const value_type input[] = {
        token::code::int16, 0xFF, 0x7F,
        token::code::int16, 0x00, 0x80,
        token::code::int16, 0xFF, 0xFF
    };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::int16);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(reader.length() == 1);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::uint8_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::uint16_t>(), 0x7FFF);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::uint32_t>(), 0x00007FFF);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::uint64_t>(), UINT64_C(0x0000000000007FFF));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::int16);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::uint8_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::uint16_t>(), 0x8000);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::uint32_t>(), 0x00008000);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::int16);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::uint8_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::uint16_t>(), 0xFFFF);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::uint32_t>(), 0x0000FFFF);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}